

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcWin.c
# Opt level: O2

void Wlc_WinProfileArith(Wlc_Ntk_t *p)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Wlc_Obj_t *pWVar4;
  ulong uVar5;
  char *pcVar6;
  int iVar7;
  Wlc_Ntk_t *pWVar8;
  long lVar9;
  uint local_3c;
  
  pWVar8 = p;
  p_00 = Vec_IntAlloc((int)p);
  p_01 = Vec_IntAlloc((int)pWVar8);
  for (iVar7 = 1; iVar3 = p->iObj, iVar7 < iVar3; iVar7 = iVar7 + 1) {
    pWVar4 = Wlc_NtkObj(p,iVar7);
    *(byte *)pWVar4 = *(byte *)pWVar4 & 0x7f;
  }
  iVar7 = 1;
  local_3c = 0;
  do {
    if (iVar3 <= iVar7) {
      iVar7 = 1;
      do {
        if (p->iObj <= iVar7) {
          printf("Finished printing %d arithmetic cones.\n",(ulong)local_3c);
          Vec_IntFree(p_00);
          Vec_IntFree(p_01);
          return;
        }
        pWVar4 = Wlc_NtkObj(p,iVar7);
        iVar7 = iVar7 + 1;
      } while ((undefined1  [24])((undefined1  [24])*pWVar4 & (undefined1  [24])0x80) ==
               (undefined1  [24])0x0);
      __assert_fail("pObj->Mark == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcWin.c"
                    ,0x9a,"void Wlc_WinProfileArith(Wlc_Ntk_t *)");
    }
    pWVar4 = Wlc_NtkObj(p,iVar7);
    iVar3 = Wlc_ObjHasArithm_rec(p,pWVar4);
    if (iVar3 == 0) {
      iVar3 = Wlc_ObjHasArithmFanins(p,pWVar4);
      if (iVar3 != 0) goto LAB_002f9625;
    }
    else if ((pWVar4->field_0x1 & 6) != 0) {
LAB_002f9625:
      Wlc_WinCompute(p,pWVar4,p_00,p_01);
      iVar3 = Wlc_ManCountArithmReal(p,p_01);
      if (1 < iVar3) {
        uVar5 = ((long)pWVar4 - (long)p->pObjs) / 0x18;
        pcVar6 = Wlc_ObjName(p,(int)uVar5);
        printf("Arithmetic cone of node %d (%s):\n",uVar5 & 0xffffffff,pcVar6);
        Wlc_NtkPrintNode(p,pWVar4);
        iVar3 = -1;
        for (lVar9 = 0; lVar9 < p_01->nSize / 2; lVar9 = lVar9 + 1) {
          piVar2 = p_01->pArray;
          iVar1 = piVar2[lVar9];
          piVar2[lVar9] = piVar2[p_01->nSize + iVar3];
          piVar2[p_01->nSize + iVar3] = iVar1;
          iVar3 = iVar3 + -1;
        }
        Wlc_NtkPrintNodeArray(p,p_01);
        putchar(10);
        local_3c = local_3c + 1;
      }
    }
    iVar7 = iVar7 + 1;
    iVar3 = p->iObj;
  } while( true );
}

Assistant:

void Wlc_WinProfileArith( Wlc_Ntk_t * p )
{
    Vec_Int_t * vLeaves = Vec_IntAlloc( 1000 );
    Vec_Int_t * vNodes  = Vec_IntAlloc( 1000 );
    Wlc_Obj_t * pObj; int i, Count = 0;
    Wlc_NtkForEachObj( p, pObj, i )
        pObj->Mark = 0;
    Wlc_NtkForEachObj( p, pObj, i )
        if ( Wlc_ObjHasArithm_rec(p, pObj) ? Wlc_ObjIsCo(pObj) : Wlc_ObjHasArithmFanins(p, pObj) )
        {
            Wlc_WinCompute( p, pObj, vLeaves, vNodes ); 
            if ( Wlc_ManCountArithmReal(p, vNodes) < 2 )
                continue;

            printf( "Arithmetic cone of node %d (%s):\n", Wlc_ObjId(p, pObj), Wlc_ObjName(p, Wlc_ObjId(p, pObj)) );
            Wlc_NtkPrintNode( p, pObj );
            Vec_IntReverseOrder( vNodes );
            Wlc_NtkPrintNodeArray( p, vNodes );
            printf( "\n" );
            Count++;
        }
    Wlc_NtkForEachObj( p, pObj, i )
        assert( pObj->Mark == 0 );
    printf( "Finished printing %d arithmetic cones.\n", Count );
    Vec_IntFree( vLeaves );
    Vec_IntFree( vNodes );
}